

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

bool __thiscall
crnlib::
hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
::insert_no_grow(hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
                 *this,insert_result *result,vec<2U,_float> *k,uint *v)

{
  bool bVar1;
  uint uVar2;
  uint *in_RCX;
  vec<2U,_float> *in_RDX;
  iterator *in_RSI;
  hash_map_type *in_RDI;
  int orig_index;
  node *pNode;
  int index;
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  *in_stack_ffffffffffffff90;
  vec<2U,_float> *in_stack_ffffffffffffff98;
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  *in_stack_ffffffffffffffa0;
  iterator local_48;
  node *local_38;
  uint local_2c;
  uint *local_28;
  vec<2U,_float> *local_20;
  iterator *local_18;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  uVar2 = vector<crnlib::hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>::raw_node>
          ::size(&in_RDI->m_values);
  if (uVar2 == 0) {
    local_1 = false;
  }
  else {
    local_2c = hash_key(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_38 = get_node(in_stack_ffffffffffffff90,(uint)((ulong)in_RDI >> 0x20));
    if (local_38->state == '\0') {
LAB_0020edeb:
      if (in_RDI->m_num_valid < in_RDI->m_grow_threshold) {
        construct_value_type(&local_38->super_value_type,local_20,local_28);
        local_38->state = '\x01';
        in_RDI->m_num_valid = in_RDI->m_num_valid + 1;
        iterator::iterator((iterator *)&stack0xffffffffffffff90,in_RDI,local_2c);
        iterator::operator=(local_18,(iterator *)&stack0xffffffffffffff90);
        *(undefined1 *)&local_18[1].m_pTable = 1;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      bVar1 = equal_to<crnlib::vec<2U,_float>_>::operator()
                        ((equal_to<crnlib::vec<2U,_float>_> *)in_stack_ffffffffffffff90,
                         (vec<2U,_float> *)in_RDI,(vec<2U,_float> *)0x20ecef);
      uVar2 = local_2c;
      if (bVar1) {
        iterator::iterator(&local_48,in_RDI,local_2c);
        iterator::operator=(local_18,&local_48);
        *(undefined1 *)&local_18[1].m_pTable = 0;
        local_1 = true;
      }
      else {
        do {
          if (local_2c == 0) {
            local_2c = vector<crnlib::hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>::raw_node>
                       ::size(&in_RDI->m_values);
            local_2c = local_2c - 1;
            local_38 = get_node(in_stack_ffffffffffffff90,(uint)((ulong)in_RDI >> 0x20));
          }
          else {
            local_2c = local_2c - 1;
            local_38 = local_38 + -1;
          }
          if (uVar2 == local_2c) {
            return false;
          }
          if (local_38->state == '\0') goto LAB_0020edeb;
          bVar1 = equal_to<crnlib::vec<2U,_float>_>::operator()
                            ((equal_to<crnlib::vec<2U,_float>_> *)in_stack_ffffffffffffff90,
                             (vec<2U,_float> *)in_RDI,(vec<2U,_float> *)0x20edad);
        } while (!bVar1);
        iterator::iterator((iterator *)&stack0xffffffffffffffa0,in_RDI,local_2c);
        iterator::operator=(local_18,(iterator *)&stack0xffffffffffffffa0);
        *(undefined1 *)&local_18[1].m_pTable = 0;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value()) {
    if (!m_values.size())
      return false;

    int index = hash_key(k);
    node* pNode = &get_node(index);

    if (pNode->state) {
      if (m_equals(pNode->first, k)) {
        result.first = iterator(*this, index);
        result.second = false;
        return true;
      }

      const int orig_index = index;

      for (;;) {
        if (!index) {
          index = m_values.size() - 1;
          pNode = &get_node(index);
        } else {
          index--;
          pNode--;
        }

        if (orig_index == index)
          return false;

        if (!pNode->state)
          break;

        if (m_equals(pNode->first, k)) {
          result.first = iterator(*this, index);
          result.second = false;
          return true;
        }
      }
    }

    if (m_num_valid >= m_grow_threshold)
      return false;

    construct_value_type(pNode, k, v);

    pNode->state = cStateValid;

    m_num_valid++;
    CRNLIB_ASSERT(m_num_valid <= m_values.size());

    result.first = iterator(*this, index);
    result.second = true;

    return true;
  }